

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v8::detail::bigint::multiply(bigint *this,uint32_t value)

{
  uint *puVar1;
  size_t sVar2;
  uint in_EAX;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  bigit carry;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar4 = 0;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    uVar3 = uVar4 + (ulong)puVar1[sVar5] * (ulong)value;
    puVar1[sVar5] = (uint)uVar3;
    uVar4 = uVar3 >> 0x20;
    uStack_8 = CONCAT44((int)(uVar3 >> 0x20),(undefined4)uStack_8);
  }
  if ((int)uVar4 != 0) {
    buffer<unsigned_int>::push_back((buffer<unsigned_int> *)this,(uint *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void multiply(uint32_t value) {
    const double_bigit wide_value = value;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * wide_value + carry;
      bigits_[i] = static_cast<bigit>(result);
      carry = static_cast<bigit>(result >> bigit_bits);
    }
    if (carry != 0) bigits_.push_back(carry);
  }